

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O2

int fy_resolve_merge_key_populate(fy_document *fyd,fy_node *fyn,fy_node_pair *fynp,fy_node *fynm)

{
  list_head *plVar1;
  _Bool _Var2;
  fy_token *pfVar3;
  fy_node_pair *value;
  fy_node *pfVar4;
  int iVar5;
  char *fmt;
  fy_token *pfVar6;
  
  if (((fyn->field_0x34 & 3) == 2) && ((fynm->field_0x34 & 3) == 2)) {
    pfVar3 = (fynm->field_12).scalar;
    while( true ) {
      pfVar6 = (fy_token *)0x0;
      if (pfVar3 != (fy_token *)&fynm->field_12) {
        pfVar6 = pfVar3;
      }
      if (pfVar6 == (fy_token *)0x0) break;
      _Var2 = fy_node_mapping_key_is_duplicate(fyn,*(fy_node **)&pfVar6->type);
      if (!_Var2) {
        value = fy_node_pair_alloc(fyd);
        if (value == (fy_node_pair *)0x0) {
          fmt = "fy_node_pair_alloc() failed";
          iVar5 = 0x9fd;
          goto LAB_001239b5;
        }
        pfVar4 = fy_node_copy(fyd,*(fy_node **)&pfVar6->type);
        value->key = pfVar4;
        pfVar4 = fy_node_copy(fyd,*(fy_node **)&pfVar6->analyze_flags);
        value->value = pfVar4;
        plVar1 = (fynp->node).next;
        plVar1->prev = &value->node;
        (value->node).next = plVar1;
        (value->node).prev = &fynp->node;
        (fynp->node).next = &value->node;
        if (fyn->xl != (fy_accel *)0x0) {
          fy_accel_insert(fyn->xl,value->key,value);
        }
      }
      pfVar3 = (fy_token *)(pfVar6->node).next;
    }
    iVar5 = 0;
  }
  else {
    fmt = "bad inputs to %s";
    iVar5 = 0x9f2;
LAB_001239b5:
    fy_document_diag(fyd,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                     ,iVar5,"fy_resolve_merge_key_populate",fmt);
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

static int fy_resolve_merge_key_populate(struct fy_document *fyd, struct fy_node *fyn,
                                         struct fy_node_pair *fynp, struct fy_node *fynm) {
    struct fy_node_pair *fynpi, *fynpn;

    if (!fyd)
        return -1;

    fyd_error_check(fyd,
                    fyn && fynp && fynm && fyn->type == FYNT_MAPPING && fynm->type == FYNT_MAPPING,
                    err_out, "bad inputs to %s", __func__);

    for (fynpi = fy_node_pair_list_head(&fynm->mapping); fynpi;
         fynpi = fy_node_pair_next(&fynm->mapping, fynpi)) {

        /* make sure we don't override an already existing key */
        if (fy_node_mapping_key_is_duplicate(fyn, fynpi->key))
            continue;

        fynpn = fy_node_pair_alloc(fyd);
        fyd_error_check(fyd, fynpn, err_out,
                        "fy_node_pair_alloc() failed");

        fynpn->key = fy_node_copy(fyd, fynpi->key);
        fynpn->value = fy_node_copy(fyd, fynpi->value);

        fy_node_pair_list_insert_after(&fyn->mapping, fynp, fynpn);
        if (fyn->xl)
            fy_accel_insert(fyn->xl, fynpn->key, fynpn);
    }

    return 0;

    err_out:
    return -1;
}